

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Data_Query_PDU::AddFixedDatum(Data_Query_PDU *this,KUINT32 FD)

{
  KUINT16 *pKVar1;
  KUINT32 local_c;
  
  local_c = FD;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->m_vFixedDatum,&local_c)
  ;
  pKVar1 = &(this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + 4;
  this->m_ui32NumFixedDatum = this->m_ui32NumFixedDatum + 1;
  return;
}

Assistant:

void Data_Query_PDU::AddFixedDatum( KUINT32 FD )
{
    m_vFixedDatum.push_back( FD );
    m_ui16PDULength += 4; // Size of KUINT32
    ++m_ui32NumFixedDatum;
}